

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O2

Uint32 __thiscall Diligent::ShaderGLImpl::GetResourceCount(ShaderGLImpl *this)

{
  element_type *peVar1;
  string msg;
  
  if ((this->m_Builder)._M_t.
      super___uniq_ptr_impl<Diligent::ShaderGLImpl::ShaderBuilder,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_std::default_delete<Diligent::ShaderGLImpl::ShaderBuilder>_>
      .super__Head_base<0UL,_Diligent::ShaderGLImpl::ShaderBuilder_*,_false>._M_head_impl !=
      (ShaderBuilder *)0x0) {
    FormatString<char[109]>
              (&msg,(char (*) [109])
                    "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetResourceCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x18b);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((((this->super_ShaderBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
       .m_pDevice)->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Features.
      SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[87]>
              (&msg,(char (*) [87])
                    "Shader resource queries are not available when separate shader objects are unsupported"
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    peVar1 = (this->m_pShaderResources).
             super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      return peVar1->m_NumStorageBlocks + peVar1->m_NumTextures +
             peVar1->m_NumImages + peVar1->m_NumUniformBuffers;
    }
  }
  return 0;
}

Assistant:

Uint32 ShaderGLImpl::GetResourceCount() const
{
    DEV_CHECK_ERR(!m_Builder, "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");

    if (m_pDevice->GetFeatures().SeparablePrograms)
    {
        return m_pShaderResources ? m_pShaderResources->GetVariableCount() : 0;
    }
    else
    {
        LOG_WARNING_MESSAGE("Shader resource queries are not available when separate shader objects are unsupported");
        return 0;
    }
}